

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

strbuf * ssh_rsakex_encrypt(RSAKey *rsa,ssh_hashalg *h,ptrlen in)

{
  uint8_t *buf;
  uint seedlen;
  uint8_t uVar1;
  size_t sVar2;
  strbuf *buf_o;
  uint8_t *puVar3;
  mp_int *base;
  mp_int *x;
  ulong __n;
  uint8_t *output;
  int iVar4;
  size_t sVar5;
  ptrlen bytes;
  
  __n = in.len;
  sVar5 = h->hlen;
  sVar2 = mp_get_nbits(rsa->modulus);
  if (__n != 0) {
    seedlen = (uint)sVar5;
    iVar4 = (int)(sVar2 + 7 >> 3);
    if (__n <= (ulong)(long)(int)(iVar4 + seedlen * -2 + -2)) {
      buf_o = strbuf_new_nm();
      bytes.len = (size_t)iVar4;
      puVar3 = (uint8_t *)strbuf_append(buf_o,bytes.len);
      *puVar3 = '\0';
      buf = puVar3 + 1;
      random_read(buf,(long)(int)seedlen);
      output = puVar3 + (long)(int)seedlen + 1;
      hash_simple(h,(ptrlen)ZEXT816(0x177fb3),output);
      memset(puVar3 + (long)(int)(seedlen * 2) + 1,0,(long)(int)(~(seedlen * 2) + iVar4));
      puVar3[~__n + bytes.len] = '\x01';
      memcpy(puVar3 + (bytes.len - __n),in.ptr,__n);
      oaep_mask(h,buf,seedlen,output,~seedlen + iVar4);
      oaep_mask(h,output,~seedlen + iVar4,buf,seedlen);
      bytes.ptr = puVar3;
      base = mp_from_bytes_be(bytes);
      x = mp_modpow(base,rsa->exponent,rsa->modulus);
      if (iVar4 != 0) {
        sVar5 = (size_t)iVar4;
        do {
          sVar5 = sVar5 - 1;
          uVar1 = mp_get_byte(x,sVar5);
          *puVar3 = uVar1;
          puVar3 = puVar3 + 1;
        } while (sVar5 != 0);
      }
      mp_free(base);
      mp_free(x);
      return buf_o;
    }
  }
  __assert_fail("in.len > 0 && in.len <= k - 2*HLEN - 2",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c",
                0x3e2,"strbuf *ssh_rsakex_encrypt(RSAKey *, const ssh_hashalg *, ptrlen)");
}

Assistant:

strbuf *ssh_rsakex_encrypt(RSAKey *rsa, const ssh_hashalg *h, ptrlen in)
{
    mp_int *b1, *b2;
    int k, i;
    char *p;
    const int HLEN = h->hlen;

    /*
     * Here we encrypt using RSAES-OAEP. Essentially this means:
     *
     *  - we have a SHA-based `mask generation function' which
     *    creates a pseudo-random stream of mask data
     *    deterministically from an input chunk of data.
     *
     *  - we have a random chunk of data called a seed.
     *
     *  - we use the seed to generate a mask which we XOR with our
     *    plaintext.
     *
     *  - then we use _the masked plaintext_ to generate a mask
     *    which we XOR with the seed.
     *
     *  - then we concatenate the masked seed and the masked
     *    plaintext, and RSA-encrypt that lot.
     *
     * The result is that the data input to the encryption function
     * is random-looking and (hopefully) contains no exploitable
     * structure such as PKCS1-v1_5 does.
     *
     * For a precise specification, see RFC 3447, section 7.1.1.
     * Some of the variable names below are derived from that, so
     * it'd probably help to read it anyway.
     */

    /* k denotes the length in octets of the RSA modulus. */
    k = (7 + mp_get_nbits(rsa->modulus)) / 8;

    /* The length of the input data must be at most k - 2hLen - 2. */
    assert(in.len > 0 && in.len <= k - 2*HLEN - 2);

    /* The length of the output data wants to be precisely k. */
    strbuf *toret = strbuf_new_nm();
    int outlen = k;
    unsigned char *out = strbuf_append(toret, outlen);

    /*
     * Now perform EME-OAEP encoding. First set up all the unmasked
     * output data.
     */
    /* Leading byte zero. */
    out[0] = 0;
    /* At position 1, the seed: HLEN bytes of random data. */
    random_read(out + 1, HLEN);
    /* At position 1+HLEN, the data block DB, consisting of: */
    /* The hash of the label (we only support an empty label here) */
    hash_simple(h, PTRLEN_LITERAL(""), out + HLEN + 1);
    /* A bunch of zero octets */
    memset(out + 2*HLEN + 1, 0, outlen - (2*HLEN + 1));
    /* A single 1 octet, followed by the input message data. */
    out[outlen - in.len - 1] = 1;
    memcpy(out + outlen - in.len, in.ptr, in.len);

    /*
     * Now use the seed data to mask the block DB.
     */
    oaep_mask(h, out+1, HLEN, out+HLEN+1, outlen-HLEN-1);

    /*
     * And now use the masked DB to mask the seed itself.
     */
    oaep_mask(h, out+HLEN+1, outlen-HLEN-1, out+1, HLEN);

    /*
     * Now `out' contains precisely the data we want to
     * RSA-encrypt.
     */
    b1 = mp_from_bytes_be(make_ptrlen(out, outlen));
    b2 = mp_modpow(b1, rsa->exponent, rsa->modulus);
    p = (char *)out;
    for (i = outlen; i--;) {
        *p++ = mp_get_byte(b2, i);
    }
    mp_free(b1);
    mp_free(b2);

    /*
     * And we're done.
     */
    return toret;
}